

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool nivalis::anon_unknown_10::parse_polyline_expr
               (string *expr_str,Function *func,Environment *env,int x_var,int y_var,int t_var,
               string *parse_err)

{
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *this;
  char cVar1;
  pointer pEVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  string *psVar8;
  pointer this_00;
  long lStackY_f0;
  string tmp_err;
  Expr e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string s;
  
  uVar4 = func->type & 0xfffffff8;
  this = &func->exprs;
  bVar6 = false;
  bVar3 = false;
  lStackY_f0 = 0;
  for (uVar7 = 0; uVar7 < expr_str->_M_string_length; uVar7 = uVar7 + 1) {
    cVar1 = (expr_str->_M_dataplus)._M_p[uVar7];
    iVar5 = isspace((int)cVar1);
    if (iVar5 == 0) {
      if (cVar1 == '(') {
LAB_00125906:
        lStackY_f0 = lStackY_f0 + 1;
      }
      else if (cVar1 == ')') {
LAB_0012590b:
        lStackY_f0 = lStackY_f0 + -1;
      }
      else {
        if (cVar1 == '[') goto LAB_00125906;
        if ((cVar1 == ']') || (cVar1 == '}')) goto LAB_0012590b;
        if (cVar1 == '{') goto LAB_00125906;
      }
      if (cVar1 == ',') {
        if (lStackY_f0 == 1) {
          tmp_err._M_dataplus._M_p = (pointer)&tmp_err.field_2;
          tmp_err._M_string_length = 0;
          tmp_err.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::substr((ulong)&s,(ulong)expr_str);
          psVar8 = &s;
          parse(&e1,&s,env,true,true,0,&tmp_err);
          util::rtrim((util *)&tmp_err,psVar8);
          if ((uVar4 == 0x80) && (tmp_err._M_string_length != 0)) {
            parse((Expr *)&local_70,&s,env,false,true,0,parse_err);
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::emplace_back<nivalis::Expr>
                      (this,(Expr *)&local_70);
            std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           *)&local_70);
            bVar6 = true;
          }
          else {
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back(this,&e1);
            if (uVar4 != 0x80) {
              std::operator+(&local_70,&tmp_err,"\n");
              std::__cxx11::string::append((string *)parse_err);
              std::__cxx11::string::~string((string *)&local_70);
            }
          }
          std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         *)&e1);
          std::__cxx11::string::~string((string *)&s);
          std::__cxx11::string::~string((string *)&tmp_err);
          bVar3 = true;
          lStackY_f0 = 1;
        }
      }
      else if (cVar1 == ')') {
        if (lStackY_f0 == 0) {
          if (!bVar3) {
            bVar6 = false;
            goto LAB_00125c92;
          }
          tmp_err._M_dataplus._M_p = (pointer)&tmp_err.field_2;
          tmp_err._M_string_length = 0;
          tmp_err.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::substr((ulong)&s,(ulong)expr_str);
          psVar8 = &s;
          parse(&e1,&s,env,true,true,0,&tmp_err);
          util::rtrim((util *)&tmp_err,psVar8);
          if ((uVar4 == 0x80) && (tmp_err._M_string_length != 0)) {
            parse((Expr *)&local_70,&s,env,false,true,0,parse_err);
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::emplace_back<nivalis::Expr>
                      (this,(Expr *)&local_70);
            std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           *)&local_70);
            bVar6 = true;
          }
          else {
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back(this,&e1);
            if (uVar4 != 0x80) {
              std::operator+(&local_70,&tmp_err,"\n");
              std::__cxx11::string::append((string *)parse_err);
              std::__cxx11::string::~string((string *)&local_70);
            }
          }
          std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         *)&e1);
          std::__cxx11::string::~string((string *)&s);
          std::__cxx11::string::~string((string *)&tmp_err);
          bVar3 = false;
          lStackY_f0 = 0;
        }
      }
      else if ((cVar1 != '(') && (cVar1 != ',' && lStackY_f0 == 0)) {
        return false;
      }
    }
  }
  if (parse_err->_M_string_length == 0) {
    pEVar2 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (this_00 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pEVar2;
        this_00 = this_00 + 1) {
      bVar3 = Expr::has_var(this_00,x_var);
      if ((bVar3) || (bVar3 = Expr::has_var(this_00,y_var), bVar3)) {
LAB_00125c7b:
        std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::clear(this);
LAB_00125c92:
        std::__cxx11::string::append((char *)parse_err);
        return bVar6;
      }
      if ((func->type == 0x80) && (bVar3 = Expr::has_var(this_00,t_var), bVar3)) {
        if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0x30) goto LAB_00125c7b;
        func->type = 0x28;
      }
    }
  }
  return bVar6;
}

Assistant:

bool parse_polyline_expr(const std::string& expr_str, Function& func,
                         Environment& env, int x_var, int y_var, int t_var,
                         std::string& parse_err) {
    // Try to parse function as polyline expr
    size_t last_begin = 0, stkh = 0;
    bool has_comma = false;
    bool want_reparse = false;
    const bool is_polyline_type = ((func.type& ~Function::FUNC_TYPE_MOD_ALL)
                            == Function::FUNC_TYPE_GEOM_POLYLINE);
    for (size_t i = 0; i < expr_str.size(); ++i) {
        const char c = expr_str[i];
        if (std::isspace(c)) continue;
        // Handle nested brackets
        if (util::is_open_bracket(c)) ++stkh;
        else if (util::is_close_bracket(c)) --stkh;
        switch(c) {
            case '(':
                if (stkh == 1) {
                    last_begin = i + 1;
                }
                break;
            case ',':
                if (stkh == 1) {
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }
                    last_begin = i + 1;
                    has_comma = true;
                }
                break;
            case ')':
                if (stkh == 0) {
                    if (!has_comma) {
                        // Must have comma
                        parse_err.append("Polyline/parametric expression missing ,");
                        return false;
                    }
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }

                    has_comma = false;
                }
                break;
            default:
                // Can't have things between ), (
                // shouldn't happen since should not detect as polyline
                if (!std::isspace(c) && c != ',' && stkh == 0) return false;
        }
    }
    if (parse_err.empty()) {
        for (Expr& e1 : func.exprs) {
            if (e1.has_var(x_var) || e1.has_var(y_var)) {
                // Can't have x,y, show warning
                func.exprs.clear();
                parse_err.append("x, y disallowed in tuple "
                    "(polyline/parametric equation)\n");
                break;
            } else if (func.type == Function::FUNC_TYPE_GEOM_POLYLINE &&
                       e1.has_var(t_var)) {
                // Detect parametric equation
                if (func.exprs.size() != 2) {
                    func.exprs.clear();
                    parse_err.append("Parametric equation can't have "
                        "more than one tuple\n");
                    break;
                } else {
                    // Parametric detection: only single
                    // point and has t
                    func.type = Function::FUNC_TYPE_PARAMETRIC;
                }
            }
        }
    }
    return want_reparse;
}